

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void handle_child_message(sockaddr_in addr_from)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  undefined8 uVar3;
  uchar auVar4 [8];
  size_type sVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  uchar extraout_RDX [8];
  uchar extraout_RDX_00 [8];
  uchar auVar9 [8];
  ulong __n;
  sockaddr_in addr;
  int id_chld;
  sockaddr_in local_448;
  Ip_Port ip_port;
  char str_addr [1000];
  
  uVar1 = *(uint *)((long)buf + 8);
  __n = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  strncpy(str_addr,(char *)((long)buf + 0xc),__n);
  auVar9 = extraout_RDX;
  uVar3 = addr_from._0_8_;
  auVar4 = addr_from.sin_zero;
  if (str_addr[0] != '0') {
    str_addr[__n] = '\0';
    parse_address(str_addr,&local_448);
    auVar9 = extraout_RDX_00;
    uVar3 = local_448._0_8_;
    auVar4 = local_448.sin_zero;
  }
  local_448.sin_zero = auVar4;
  local_448._0_8_ = uVar3;
  uVar3 = local_448._0_8_;
  __stream = _stderr;
  addr.sin_zero[0] = auVar9[0];
  addr.sin_zero[1] = auVar9[1];
  addr.sin_zero[2] = auVar9[2];
  addr.sin_zero[3] = auVar9[3];
  addr.sin_zero[4] = auVar9[4];
  addr.sin_zero[5] = auVar9[5];
  addr.sin_zero[6] = auVar9[6];
  addr.sin_zero[7] = auVar9[7];
  addr.sin_family = local_448.sin_family;
  addr.sin_port = local_448.sin_port;
  addr.sin_addr.s_addr = local_448.sin_addr.s_addr;
  pack_address_abi_cxx11_((string *)&ip_port,addr);
  fprintf(__stream,"Receive child with address: %s\n",
          CONCAT26(ip_port._6_2_,CONCAT24(ip_port.second,ip_port.first)));
  std::__cxx11::string::~string((string *)&ip_port);
  ip_port.second = SUB82(uVar3,2);
  ip_port.first = SUB84(uVar3,4);
  sVar5 = std::
          map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::count(&idconnections,&ip_port);
  iVar2 = global_map_id;
  if (sVar5 == 0) {
    pmVar6 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&ip_port);
    *pmVar6 = iVar2;
    pmVar7 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,&global_map_id);
    pmVar7->sin_family = local_448.sin_family;
    pmVar7->sin_port = local_448.sin_port;
    pmVar7->sin_addr = (in_addr)local_448.sin_addr.s_addr;
    *&pmVar7->sin_zero = local_448.sin_zero;
    global_map_id = global_map_id + 1;
  }
  pmVar6 = std::
           map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
           ::operator[](&idconnections,&ip_port);
  id_chld = *pmVar6;
  sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&children,&id_chld);
  if (sVar8 == 0) {
    fwrite("Insert this new child to set\n",0x1d,1,_stderr);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&children
               ,&id_chld);
  }
  return;
}

Assistant:

void handle_child_message(struct sockaddr_in addr_from) {
    size_t size_addr = ntohl(((uint32_t*)buf)[2]);
    char str_addr[ADDRESS_MAX_SIZE];
    strncpy(str_addr, (char*)buf + 3 * sizeof(int), size_addr);

    struct sockaddr_in addr;
    if (str_addr[0] == '0') {
        addr = addr_from;
    }
    else {
        str_addr[size_addr] = '\0';
        parse_address(str_addr, addr);
    }
    fprintf(stderr, "Receive child with address: %s\n", pack_address(addr).c_str());

    Ip_Port ip_port = get_ip_port(addr);
    if (!idconnections.count(ip_port)) {
        idconnections[ip_port] = global_map_id;
        connections[global_map_id] = addr;
        ++global_map_id;
    }

    int id_chld = idconnections[ip_port];
    if (!children.count(id_chld)) {
        fprintf(stderr, "Insert this new child to set\n");
        children.insert(id_chld);
    }
}